

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O3

void __thiscall
google::protobuf::io::Printer::Annotate<google::protobuf::Descriptor>
          (Printer *this,string_view begin_varname,string_view end_varname,Descriptor *descriptor,
          optional<google::protobuf::io::AnnotationCollector::Semantic> semantic)

{
  string *psVar1;
  string_view file_path;
  vector<int,_std::allocator<int>_> path;
  vector<int,_std::allocator<int>_> local_58;
  size_t local_40;
  char *pcStack_38;
  
  if ((this->options_).annotation_collector != (AnnotationCollector *)0x0) {
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    Descriptor::GetLocationPath(descriptor,&local_58);
    psVar1 = descriptor->file_->name_;
    pcStack_38 = (psVar1->_M_dataplus)._M_p;
    local_40 = psVar1->_M_string_length;
    file_path._M_str = pcStack_38;
    file_path._M_len = local_40;
    Annotate(this,begin_varname,end_varname,file_path,&local_58,semantic);
    if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void Printer::Annotate(absl::string_view begin_varname,
                       absl::string_view end_varname, const Desc* descriptor,
                       absl::optional<AnnotationCollector::Semantic> semantic) {
  if (options_.annotation_collector == nullptr) {
    return;
  }

  std::vector<int> path;
  descriptor->GetLocationPath(&path);
  Annotate(begin_varname, end_varname, descriptor->file()->name(), path,
           semantic);
}